

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# latency_dump.h
# Opt level: O0

string * LatencyDumpDefaultImpl::getActualFunction(string *str,bool add_tab)

{
  byte in_DL;
  string *in_RSI;
  string *in_RDI;
  size_t i;
  size_t pos;
  size_t level;
  string *ret;
  string *psVar1;
  string local_68 [32];
  ulong local_48;
  allocator local_2a;
  undefined1 local_29;
  undefined8 local_28;
  size_t local_20;
  byte local_11;
  string *local_10;
  
  local_11 = in_DL & 1;
  psVar1 = in_RDI;
  local_10 = in_RSI;
  local_20 = getNumStacks((string *)in_RDI);
  if (local_20 == 0) {
    std::__cxx11::string::string(in_RDI,local_10);
  }
  else {
    local_28 = std::__cxx11::string::rfind((char *)local_10,0x11216a);
    local_29 = 0;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(in_RDI,"",&local_2a);
    std::allocator<char>::~allocator((allocator<char> *)&local_2a);
    if ((1 < local_20) && ((local_11 & 1) != 0)) {
      for (local_48 = 1; local_48 < local_20; local_48 = local_48 + 1) {
        std::__cxx11::string::operator+=(in_RDI,"  ");
      }
    }
    std::__cxx11::string::substr((ulong)local_68,(ulong)local_10);
    std::__cxx11::string::operator+=(in_RDI,local_68);
    std::__cxx11::string::~string(local_68);
  }
  return psVar1;
}

Assistant:

static std::string getActualFunction(const std::string& str,
                                         bool add_tab = true) {
        size_t level = getNumStacks(str);
        if (!level) {
            return str;
        }

        size_t pos = str.rfind(" ## ");
        std::string ret = "";
        if (level > 1 && add_tab) {
            for (size_t i=1; i<level; ++i) {
                ret += "  ";
            }
        }
        ret += str.substr(pos + 4);
        return ret;
    }